

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O1

int UpnpSendAction(UpnpClient_Handle Hnd,char *ActionURL_const,char *ServiceType_const,
                  char *DevUDN_const,IXML_Document *Action,IXML_Document **RespNodePtr)

{
  Upnp_Handle_Type UVar1;
  int iVar2;
  int line;
  Handle_Info *SInfo;
  Handle_Info *local_38;
  
  line = (int)&local_38;
  local_38 = (Handle_Info *)0x0;
  iVar2 = -0x74;
  if (UpnpSdkInit == 1) {
    iVar2 = 6;
    UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xb4a,"Inside UpnpSendAction\n");
    if (DevUDN_const != (char *)0x0) {
      iVar2 = 6;
      UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xb4f,"non NULL DevUDN is ignored\n");
    }
    HandleReadLock((char *)0xb54,iVar2);
    UVar1 = GetHandleInfo(Hnd,&local_38);
    if (UVar1 == HND_CLIENT) {
      HandleUnlock((char *)0xb5c,line);
      iVar2 = -0x65;
      if ((ActionURL_const != (char *)0x0) &&
         (RespNodePtr != (IXML_Document **)0x0 &&
          (Action != (IXML_Document *)0x0 && ServiceType_const != (char *)0x0))) {
        iVar2 = SoapSendAction(ActionURL_const,ServiceType_const,Action,RespNodePtr);
        UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xb6b,"Exiting UpnpSendAction\n");
      }
    }
    else {
      HandleUnlock((char *)0xb59,line);
      iVar2 = -100;
    }
  }
  return iVar2;
}

Assistant:

int UpnpSendAction(UpnpClient_Handle Hnd,
	const char *ActionURL_const,
	const char *ServiceType_const,
	const char *DevUDN_const,
	IXML_Document *Action,
	IXML_Document **RespNodePtr)
{
	struct Handle_Info *SInfo = NULL;
	int retVal = 0;
	char *ActionURL = (char *)ActionURL_const;
	char *ServiceType = (char *)ServiceType_const;
	/* udn not used? */
	/*char *DevUDN = (char *)DevUDN_const;*/

	if (UpnpSdkInit != 1) {
		return UPNP_E_FINISH;
	}

	UpnpPrintf(
		UPNP_ALL, API, __FILE__, __LINE__, "Inside UpnpSendAction\n");
	if (DevUDN_const != NULL) {
		UpnpPrintf(UPNP_ALL,
			API,
			__FILE__,
			__LINE__,
			"non NULL DevUDN is ignored\n");
	}
	DevUDN_const = NULL;

	HandleReadLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_CLIENT:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}
	HandleUnlock(__FILE__, __LINE__);

	if (ActionURL == NULL) {
		return UPNP_E_INVALID_PARAM;
	}

	if (ServiceType == NULL || Action == NULL || RespNodePtr == NULL ||
		DevUDN_const != NULL) {

		return UPNP_E_INVALID_PARAM;
	}

	retVal = SoapSendAction(ActionURL, ServiceType, Action, RespNodePtr);

	UpnpPrintf(
		UPNP_ALL, API, __FILE__, __LINE__, "Exiting UpnpSendAction\n");

	return retVal;
}